

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void set_done(vw *all)

{
  all->early_terminate = true;
  lock_done(all->p);
  return;
}

Assistant:

void set_done(vw& all)
{
  all.early_terminate = true;
  lock_done(*all.p);
}